

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sphere.cpp
# Opt level: O1

Vector3 * __thiscall
Sphere::getPoint(Vector3 *__return_storage_ptr__,Sphere *this,double u,double v)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double __x;
  Vector3 local_48;
  Vector3 local_30;
  
  dVar1 = (u + u) * ::PI;
  __x = ::PI * (v + -0.5);
  dVar2 = cos(dVar1);
  dVar3 = cos(__x);
  dVar1 = sin(dVar1);
  dVar4 = cos(__x);
  local_48.z = sin(__x);
  local_48.x = dVar3 * dVar2;
  local_48.y = dVar4 * dVar1;
  operator*(&local_48,&this->r);
  operator+(&local_30,&this->center);
  return __return_storage_ptr__;
}

Assistant:

Vector3 Sphere::getPoint(double u, double v)
{
    double theta = u * 2 * PI, phi = (v - .5) * PI;
    return Vector3(cos(theta) * cos(phi), sin(theta) * cos(phi), sin(phi)) * r + center;
}